

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesRasGetProperties(zes_ras_handle_t hRas,zes_ras_properties_t *pProperties)

{
  zes_pfnRasGetProperties_t pfnGetProperties;
  ze_result_t result;
  zes_ras_properties_t *pProperties_local;
  zes_ras_handle_t hRas_local;
  
  pfnGetProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cdd0 != (code *)0x0) {
    pfnGetProperties._4_4_ = (*DAT_0011cdd0)(hRas,pProperties);
  }
  return pfnGetProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasGetProperties(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_properties_t* pProperties               ///< [in,out] Structure describing RAS properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetProperties = context.zesDdiTable.Ras.pfnGetProperties;
        if( nullptr != pfnGetProperties )
        {
            result = pfnGetProperties( hRas, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }